

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::AnnotateSize
          (RepeatedField<absl::lts_20250127::Cord> *this,int old_size,int new_size)

{
  Nullable<const_char_*> failure_msg;
  char *pcStack_20;
  LogMessage LStack_18;
  
  if ((old_size != new_size) &&
     ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    pcStack_20 = (char *)((this->soo_rep_).field_0.long_rep.elements_int & 0xfffffffffffffff8);
    LStack_18.errno_saver_.saved_errno_ = 0;
    LStack_18._4_4_ = 0;
    failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<char*,decltype(nullptr)>
                            (&pcStack_20,(void **)&LStack_18,"ret != nullptr");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x99,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  return;
}

Assistant:

void AnnotateSize(int old_size, int new_size) const {
    if (old_size != new_size) {
      [[maybe_unused]] const bool is_soo = this->is_soo();
      [[maybe_unused]] const Element* elem = unsafe_elements(is_soo);
      ABSL_ANNOTATE_CONTIGUOUS_CONTAINER(elem, elem + Capacity(is_soo),
                                         elem + old_size, elem + new_size);
      if (new_size < old_size) {
        ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(
            elem + new_size, (old_size - new_size) * sizeof(Element));
      }
    }
  }